

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

void __thiscall
helics::LogManager::updateRemote(LogManager *this,GlobalFederateId destination,int level)

{
  pointer ppVar1;
  int iVar2;
  pair<helics::GlobalFederateId,_int> *rl;
  pointer ppVar3;
  bool bVar4;
  int local_10;
  GlobalFederateId local_c;
  
  ppVar3 = (this->remoteTargets).
           super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->remoteTargets).
           super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = ppVar3 == ppVar1;
  if (!bVar4) {
    iVar2 = (ppVar3->first).gid;
    while (iVar2 != destination.gid) {
      ppVar3 = ppVar3 + 1;
      bVar4 = ppVar3 == ppVar1;
      if (bVar4) goto LAB_00332675;
      iVar2 = (ppVar3->first).gid;
    }
    ppVar3->second = level;
    if (!bVar4) {
      return;
    }
  }
LAB_00332675:
  local_10 = level;
  local_c.gid = destination.gid;
  std::
  vector<std::pair<helics::GlobalFederateId,int>,std::allocator<std::pair<helics::GlobalFederateId,int>>>
  ::emplace_back<helics::GlobalFederateId&,int&>
            ((vector<std::pair<helics::GlobalFederateId,int>,std::allocator<std::pair<helics::GlobalFederateId,int>>>
              *)&this->remoteTargets,&local_c,&local_10);
  iVar2 = this->fileLogLevel;
  if (this->fileLogLevel < this->consoleLogLevel) {
    iVar2 = this->consoleLogLevel;
  }
  for (ppVar3 = (this->remoteTargets).
                super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != (this->remoteTargets).
                super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    if (iVar2 < ppVar3->second) {
      iVar2 = ppVar3->second;
    }
  }
  LOCK();
  (this->maxLogLevel).super___atomic_base<int>._M_i = iVar2;
  UNLOCK();
  return;
}

Assistant:

void LogManager::updateRemote(GlobalFederateId destination, int level)
{
    for (auto& rl : remoteTargets) {
        if (rl.first == destination) {
            rl.second = level;
            return;
        }
    }
    remoteTargets.emplace_back(destination, level);
    updateMaxLogLevel();
}